

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_interp_encode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  int64_t *piVar1;
  stack *psVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  long extraout_RDX;
  undefined8 *__s;
  int64_t iVar6;
  undefined8 *puVar7;
  long lVar8;
  size_t __size;
  uint64_t *puVar9;
  uint64_t *puVar10;
  stack *psVar11;
  long in_R8;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint64_t uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM1 [64];
  
  *A = 0;
  A[n] = 0x8000000;
  uVar15 = 0x40 - LZCOUNT(n - 1);
  if (n - 1 == 0) {
    uVar15 = 0;
  }
  if (shuff_interp_encode::ss <= uVar15) {
    puVar7 = (undefined8 *)(uVar15 * 0x10 + 0x10);
    psVar2 = (stack *)realloc(shuff_interp_encode::s,(size_t)puVar7);
    if (psVar2 == (stack *)0x0) {
      psVar11 = shuff_interp_encode::s;
      shuff_interp_encode::s = psVar2;
      shuff_interp_encode();
      *puVar7 = 0;
      puVar7[extraout_RDX] = 0x8000000;
      lVar8 = LZCOUNT(extraout_RDX + -1);
      uVar15 = 0x40 - lVar8;
      if (extraout_RDX + -1 == 0) {
        uVar15 = 0;
      }
      if (shuff_interp_decode::ss <= uVar15) {
        __size = uVar15 * 0x10 + 0x10;
        psVar2 = (stack *)realloc(shuff_interp_decode::s,__size);
        if (psVar2 == (stack *)0x0) {
          psVar11 = shuff_interp_decode::s;
          shuff_interp_decode::s = psVar2;
          shuff_interp_decode();
          if (-1 < in_R8) {
            puVar7 = (undefined8 *)((long)__s + in_R8 * 8 + 1);
            puVar5 = __s + 1;
            if (__s + 1 < puVar7) {
              puVar5 = puVar7;
            }
            memset(__s,0,(~(ulong)__s + (long)puVar5 & 0xfffffffffffffff8) + 8);
          }
          if ((long)__size < 1) {
            lVar3 = 0;
          }
          else {
            piVar1 = &psVar11->lo;
            lVar3 = 0;
            do {
              uVar15 = (ulong)((int)psVar11->lo + 1);
              lVar13 = __s[uVar15];
              if (lVar13 == 0) {
                *(ulong *)(lVar8 + lVar3 * 8) = uVar15;
                lVar3 = lVar3 + 1;
                lVar13 = __s[uVar15];
              }
              psVar11 = (stack *)((long)&psVar11->lo + 4);
              __s[uVar15] = lVar13 + 1;
            } while (psVar11 < (stack *)((long)piVar1 + __size * 4));
          }
          *__s = 1;
          *(undefined8 *)(lVar8 + lVar3 * 8) = 0;
          return;
        }
        shuff_interp_decode::ss = uVar15 + 1;
        shuff_interp_decode::s = psVar2;
      }
      psVar2 = shuff_interp_decode::s;
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
      lVar8 = 1;
      auVar26 = vpternlogd_avx512f(in_ZMM1,in_ZMM1,in_ZMM1,0xff);
      shuff_interp_decode::s->lo = 0;
      psVar2->hi = extraout_RDX;
      do {
        lVar13 = 1;
        uVar15 = psVar2[lVar8 + -1].lo;
        lVar3 = psVar2[lVar8 + -1].hi;
        lVar14 = puVar7[lVar3] - (puVar7[uVar15] + (lVar3 - uVar15));
        lVar4 = lVar14 + 1;
        if (lVar4 != 1) {
          uVar21 = LZCOUNT(lVar14);
          if (uVar21 == 0x3f) {
            uVar19 = 0;
          }
          else {
            uVar23 = psVar11[2].lo;
            uVar17 = uVar21 ^ 0x3f;
            uVar19 = (ulong)(*(long *)psVar11[1].hi << ((ulong)(byte)-(char)uVar23 & 0x3f)) >>
                     ((ulong)((int)uVar21 + 1) & 0x3f);
            iVar6 = uVar23 - uVar17;
            if (uVar23 < uVar17 || iVar6 == 0) {
              puVar20 = (ulong *)((long *)psVar11[1].hi + 1);
              lVar13 = uVar17 - uVar23;
              psVar11[1].hi = (int64_t)puVar20;
              psVar11[2].lo = 0x40;
              if (lVar13 == 0 || (long)uVar17 < (long)uVar23) goto LAB_0012efc2;
              iVar6 = 0x40 - lVar13;
              uVar19 = uVar19 | *puVar20 >> (-lVar13 & 0x3fU);
            }
            psVar11[2].lo = iVar6;
          }
LAB_0012efc2:
          lVar4 = (1 << ((byte)-(char)uVar21 & 0x1f)) - lVar4;
          if (lVar4 <= (long)uVar19) {
            puVar20 = (ulong *)psVar11[1].hi;
            uVar23 = psVar11[2].lo - 1;
            psVar11[2].lo = uVar23;
            uVar21 = *puVar20;
            if (uVar23 == 0) {
              psVar11[1].hi = (int64_t)(puVar20 + 1);
              psVar11[2].lo = 0x40;
            }
            uVar19 = (uVar19 * 2 - lVar4) + (ulong)((uVar21 >> (uVar23 & 0x3f) & 1) != 0);
          }
          lVar13 = uVar19 + 1;
        }
        lVar12 = (long)(lVar3 - uVar15) >> 1;
        lVar14 = lVar8 + -1;
        lVar4 = lVar12 + uVar15;
        puVar7[lVar4] = lVar13;
        lVar13 = lVar13 + -1 + puVar7[uVar15] + lVar12;
        puVar7[lVar4] = lVar13;
        if (puVar7[lVar3] - lVar13 == lVar3 - lVar4) {
          if (lVar4 + 1 < lVar3) {
            auVar27 = vpbroadcastq_avx512f();
            auVar27 = vpaddq_avx512f(auVar27,auVar24);
            auVar28 = vpbroadcastq_avx512f();
            uVar21 = 0;
            do {
              auVar29 = vpbroadcastq_avx512f();
              auVar30 = vpsubq_avx512f(auVar27,auVar26);
              auVar27 = vpaddq_avx512f(auVar27,auVar25);
              auVar29 = vporq_avx512f(auVar29,auVar24);
              vpcmpuq_avx512f(auVar29,auVar28,2);
              auVar29 = vmovdqu64_avx512f(auVar30);
              *(undefined1 (*) [64])(puVar7 + lVar4 + 1 + uVar21) = auVar29;
              uVar21 = uVar21 + 8;
            } while ((((lVar3 + ~uVar15) - lVar12) + 7 & 0xfffffffffffffff8) != uVar21);
          }
        }
        else if (1 < lVar3 - lVar4) {
          psVar2[lVar14].lo = lVar4;
          psVar2[lVar14].hi = lVar3;
          lVar14 = lVar8;
        }
        lVar8 = lVar14;
        if (puVar7[lVar4] - puVar7[uVar15] == lVar12) {
          if (1 < lVar12) {
            auVar27 = vpbroadcastq_avx512f();
            auVar27 = vpaddq_avx512f(auVar27,auVar24);
            lVar3 = uVar15 + 2;
            if ((long)(uVar15 + 2) < lVar4) {
              lVar3 = lVar4;
            }
            uVar21 = 0;
            auVar28 = vpbroadcastq_avx512f();
            do {
              auVar29 = vpbroadcastq_avx512f();
              auVar30 = vpsubq_avx512f(auVar27,auVar26);
              auVar27 = vpaddq_avx512f(auVar27,auVar25);
              auVar29 = vporq_avx512f(auVar29,auVar24);
              vpcmpuq_avx512f(auVar29,auVar28,2);
              auVar29 = vmovdqu64_avx512f(auVar30);
              *(undefined1 (*) [64])(puVar7 + uVar15 + uVar21 + 1) = auVar29;
              uVar21 = uVar21 + 8;
            } while ((lVar3 + 7 + ~uVar15 & 0xfffffffffffffff8) != uVar21);
          }
        }
        else if (1 < lVar12) {
          psVar2[lVar8].lo = uVar15;
          psVar2[lVar8].hi = lVar4;
          lVar8 = lVar8 + 1;
        }
        if (lVar8 == 0) {
          return;
        }
      } while( true );
    }
    shuff_interp_encode::ss = uVar15 + 1;
    shuff_interp_encode::s = psVar2;
  }
  psVar2 = shuff_interp_encode::s;
  shuff_interp_encode::s->lo = 0;
  psVar2->hi = n;
  lVar8 = 1;
  puVar9 = bio->out_u64;
  do {
    lVar13 = psVar2[lVar8 + -1].lo;
    lVar14 = psVar2[lVar8 + -1].hi;
    uVar21 = (A[lVar14] - (lVar14 - lVar13)) - A[lVar13];
    uVar15 = lVar14 - lVar13 >> 1;
    lVar3 = uVar15 + lVar13;
    lVar4 = 0x40 - LZCOUNT(uVar21);
    if (uVar21 == 0) {
      lVar4 = 0;
    }
    lVar22 = ~uVar21 + (long)(1 << ((uint)lVar4 & 0x1f));
    lVar16 = A[lVar3] - (A[lVar13] + uVar15);
    lVar12 = lVar22;
    if (lVar16 < lVar22) {
      lVar12 = 0;
    }
    uVar21 = lVar4 - (ulong)(lVar16 < lVar22);
    uVar23 = lVar12 + lVar16;
    if (uVar21 < bio->buff_btg) {
      *puVar9 = *puVar9 << (uVar21 & 0x3f) | uVar23;
      uVar18 = bio->buff_btg - uVar21;
      puVar10 = puVar9;
    }
    else {
      uVar19 = *puVar9 << (bio->buff_btg & 0x3f);
      *puVar9 = uVar19;
      puVar10 = puVar9 + 1;
      *puVar9 = uVar23 >> ((ulong)(uint)((int)uVar21 - (int)bio->buff_btg) & 0x3f) | uVar19;
      bio->out_u64 = puVar10;
      puVar9[1] = uVar23;
      uVar18 = (bio->buff_btg - uVar21) + 0x40;
    }
    lVar4 = lVar8 + -1;
    bio->buff_btg = uVar18;
    if ((1 < lVar14 - lVar3) && ((ulong)(lVar14 - lVar3) < A[lVar14] - A[lVar3])) {
      psVar2[lVar4].lo = lVar3;
      psVar2[lVar4].hi = lVar14;
      lVar4 = lVar8;
    }
    lVar8 = lVar4;
    if ((1 < (long)uVar15) && (uVar15 < A[lVar3] - A[lVar13])) {
      lVar8 = lVar4 + 1;
      psVar2[lVar4].lo = lVar13;
      psVar2[lVar4].hi = lVar3;
    }
    puVar9 = puVar10;
  } while (lVar8 != 0);
  return;
}

Assistant:

void shuff_interp_encode(bit_io_t* bio, uint64_t* A, uint64_t n)
{
    int64_t lo, hi, mid, range;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_ENCODE(bio, A[mid] - (A[lo] + (mid - lo - 1)), range);
        if ((hi - mid > 1) && (A[hi] - A[mid] > (uint64_t)(hi - mid)))
            SHUFF_PUSH(mid, hi);
        if ((mid - lo > 1) && (A[mid] - A[lo] > (uint64_t)(mid - lo)))
            SHUFF_PUSH(lo, mid);
    }
}